

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O1

aom_rational arg_parse_rational_helper(arg *arg,char *err_msg)

{
  char cVar1;
  char *in_RAX;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *__format;
  ulong uVar5;
  char *endptr;
  char *local_28;
  
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  local_28 = in_RAX;
  uVar2 = strtol(arg->val,&local_28,10);
  if ((*arg->val == '\0') || (*local_28 != '/')) {
    if (err_msg == (char *)0x0) goto LAB_0011fbc7;
    pcVar4 = arg->name;
    cVar1 = *local_28;
    __format = "Option %s: Expected / at \'%c\'\n";
    uVar2 = 0;
  }
  else {
    if ((long)(int)uVar2 != uVar2) {
      if (err_msg != (char *)0x0) {
        snprintf(err_msg,200,"Option %s: Value %ld out of range for signed int\n",arg->name,uVar2);
      }
LAB_0011fbc7:
      uVar5 = 0x100000000;
      uVar2 = 0;
      goto LAB_0011fbc9;
    }
    lVar3 = strtol(local_28 + 1,&local_28,10);
    if ((*arg->val != '\0') && (*local_28 == '\0')) {
      if ((int)lVar3 == lVar3) {
        uVar5 = lVar3 << 0x20;
      }
      else {
        uVar5 = 0x100000000;
        if (err_msg != (char *)0x0) {
          snprintf(err_msg,200,"Option %s: Value %ld out of range for signed int\n",arg->name,lVar3)
          ;
        }
      }
      goto LAB_0011fbc9;
    }
    uVar5 = 0x100000000;
    if (err_msg == (char *)0x0) goto LAB_0011fbc9;
    pcVar4 = arg->name;
    cVar1 = *local_28;
    __format = "Option %s: Invalid character \'%c\'\n";
  }
  uVar5 = 0x100000000;
  snprintf(err_msg,200,__format,pcVar4,(ulong)(uint)(int)cVar1);
LAB_0011fbc9:
  return (aom_rational)(uVar2 & 0xffffffff | uVar5);
}

Assistant:

struct aom_rational arg_parse_rational_helper(const struct arg *arg,
                                              char *err_msg) {
  long rawval;  // NOLINT
  char *endptr;
  struct aom_rational rat = { 0, 1 };

  if (err_msg) err_msg[0] = '\0';

  /* parse numerator */
  rawval = strtol(arg->val, &endptr, 10);

  if (arg->val[0] != '\0' && endptr[0] == '/') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) {
      rat.num = (int)rawval;
    } else {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return rat;
    }
  } else {
    SET_ERR_STRING("Option %s: Expected / at '%c'\n", arg->name, *endptr);
    return rat;
  }

  /* parse denominator */
  rawval = strtol(endptr + 1, &endptr, 10);

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) {
      rat.den = (int)rawval;
    } else {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return rat;
    }
  } else {
    SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
    return rat;
  }

  return rat;
}